

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall
amrex::Amr::timeStep(Amr *this,int level,Real time,int iteration,int niter,Real stop_time)

{
  int *piVar1;
  ostringstream *poVar2;
  double dVar3;
  int iVar4;
  uint uVar5;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var6;
  pointer pdVar7;
  pointer piVar8;
  int iVar9;
  bool bVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int old_finest_1;
  int level_00;
  int iVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  int old_finest;
  uint uVar19;
  double dVar20;
  Print local_1b8;
  
  this->which_level_being_advanced = level;
  uVar16 = (ulong)level;
  *(undefined4 *)
   ((long)(this->amr_level).
          super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          .
          super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
          super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> + 0x20c) = 0
  ;
  iVar11 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  if ((iVar11 == 0) && ((anonymous_namespace)::regrid_on_restart != 0)) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x10])(this);
  }
  else {
    iVar14 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    iVar17 = iVar11 + -1;
    if (iVar14 <= iVar11 + -1) {
      iVar17 = iVar14;
    }
    if (level <= iVar17) {
      lVar15 = uVar16 - 1;
      uVar13 = uVar16;
      do {
        level_00 = (int)uVar13;
        bVar10 = okToRegrid(this,level_00);
        if (bVar10) {
          (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])(time,this,uVar13 & 0xffffffff,0);
          if ((level_00 == 0) && (compute_new_dt_on_regrid != 0)) {
            _Var6.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
            .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                 (((this->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
            (**(code **)(*(long *)_Var6.
                                  super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                  .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                        0x70))(stop_time,
                               _Var6.
                               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                               .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                               *(undefined4 *)
                                &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
                               this->sub_cycle,&this->n_cycle,
                               &(this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,
                               &this->dt_min,&this->dt_level,1);
          }
          iVar11 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
          if (level_00 <= iVar11) {
            piVar8 = (this->level_count).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            lVar12 = lVar15;
            do {
              piVar8[lVar12 + 1] = 0;
              iVar11 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
              lVar12 = lVar12 + 1;
            } while (lVar12 < iVar11);
          }
          if (iVar14 < iVar11) {
            pdVar7 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar8 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
            lVar12 = (long)iVar14;
            dVar20 = pdVar7[lVar12];
            do {
              dVar20 = dVar20 / (double)piVar8[lVar12 + 1];
              pdVar7[lVar12 + 1] = dVar20;
              lVar12 = lVar12 + 1;
            } while (iVar11 != lVar12);
          }
        }
        iVar11 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
        iVar4 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
        iVar9 = iVar11 + -1;
        if (iVar4 <= iVar11 + -1) {
          iVar9 = iVar4;
        }
        if (iVar4 < iVar14) {
          iVar17 = iVar9;
        }
        uVar13 = uVar13 + 1;
        lVar15 = lVar15 + 1;
        iVar14 = iVar4;
      } while (level_00 < iVar17);
    }
    if ((((iVar11 == 0) && (0 < this->loadbalance_level0_int)) &&
        (this->loadbalance_with_workestimates != 0)) &&
       ((*(this->level_steps).super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start ==
         1 || (this->loadbalance_level0_int <=
               *(this->level_count).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start)))) {
      LoadBalanceLevel0(this,time);
      *(this->level_count).super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 0;
    }
  }
  if (((anonymous_namespace)::plotfile_on_restart != 0) &&
     ((this->restart_chkfile)._M_string_length != 0)) {
    (anonymous_namespace)::plotfile_on_restart = 0;
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])(this);
  }
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_00816950 + -0x30);
    poVar2 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[Level ",7);
    std::ostream::operator<<(poVar2,level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," step ",6);
    std::ostream::operator<<
              (poVar2,(this->level_steps).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[uVar16] + 1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"ADVANCE with dt = ",0x12);
    std::ostream::_M_insert<double>
              ((this->dt_level).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar16]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"\n",1);
    Print::~Print(&local_1b8);
  }
  _Var6.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  dVar20 = (double)(**(code **)(*(long *)_Var6.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                         _M_head_impl + 0x78))
                             (time,(this->dt_level).super_vector<double,_std::allocator<double>_>.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar16],
                              _Var6.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                              iteration,niter);
  pdVar7 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  if ((iteration != 1) && (dVar3 = pdVar7[uVar16], dVar3 <= dVar20)) {
    dVar20 = dVar3;
  }
  pdVar7[uVar16] = dVar20;
  piVar1 = (this->level_steps).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
           uVar16;
  *piVar1 = *piVar1 + 1;
  piVar1 = (this->level_count).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
           uVar16;
  *piVar1 = *piVar1 + 1;
  if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_1b8.os = OutStream();
    local_1b8.rank = *(int *)(DAT_00816950 + -0x30);
    poVar2 = &local_1b8.ss;
    local_1b8.comm = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"[Level ",7);
    std::ostream::operator<<(poVar2,level);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," step ",6);
    std::ostream::operator<<
              (poVar2,(this->level_steps).super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[uVar16]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"] ",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"Advanced ",9);
    AmrLevel::countCells
              ((AmrLevel *)
               (this->amr_level).
               super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>);
    std::ostream::_M_insert<long>((long)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," cells\n",7);
    Print::~Print(&local_1b8);
  }
  iVar11 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
  iVar14 = iVar11;
  if (*(int *)((long)(this->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> +
              0x20c) != 0) {
    (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[7])
              (time,stop_time,this,(ulong)(uint)level,0);
    iVar14 = *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
    if (iVar11 < iVar14) {
      lVar15 = (long)iVar11;
      pdVar7 = (this->dt_level).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      piVar8 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      dVar20 = pdVar7[lVar15];
      do {
        dVar20 = dVar20 / (double)piVar8[lVar15 + 1];
        pdVar7[lVar15 + 1] = dVar20;
        lVar15 = lVar15 + 1;
      } while (iVar14 != lVar15);
    }
  }
  if (level < iVar14) {
    uVar18 = level + 1;
    if (this->sub_cycle == 0) {
      (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])
                (time,stop_time,this,(ulong)uVar18,1,1);
    }
    else {
      uVar5 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [(int)uVar18];
      if (0 < (int)uVar5) {
        uVar19 = 0;
        do {
          dVar20 = (double)(int)uVar19;
          uVar19 = uVar19 + 1;
          (*(this->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])
                    (dVar20 * (this->dt_level).super_vector<double,_std::allocator<double>_>.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[(int)uVar18] + time,stop_time,this,
                     (ulong)uVar18,(ulong)uVar19,(ulong)uVar5);
        } while (uVar5 != uVar19);
      }
    }
  }
  _Var6.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
  super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
  super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
       (this->amr_level).
       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_t.
       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
  (**(code **)(*(long *)_Var6.
                        super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                        .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x80))
            (_Var6.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
             _M_t.super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
             super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,iteration);
  this->which_level_being_advanced = -1;
  return;
}

Assistant:

void
Amr::timeStep (int  level,
               Real time,
               int  iteration,
               int  niter,
               Real stop_time)
{
    BL_PROFILE("Amr::timeStep()");
    BL_COMM_PROFILE_NAMETAG("Amr::timeStep TOP");

    // This is used so that the AmrLevel functions can know which level is being advanced
    //      when regridding is called with possible lbase > level.
    which_level_being_advanced = level;


    // Update so that by default, we don't force a post-step regrid.
    amr_level[level]->setPostStepRegrid(0);

    //
    // Allow regridding of level 0 calculation on restart.
    //
    if (max_level == 0 && regrid_on_restart)
    {
        regrid_level_0_on_restart();
    }
    else
    {
        int lev_top = std::min(finest_level, max_level-1);
        for (int i(level); i <= lev_top; ++i)
        {
            const int old_finest = finest_level;

            if (okToRegrid(i))
            {
                regrid(i,time);

                //
                // Compute new dt after regrid if at level 0 and compute_new_dt_on_regrid.
                //
                if ( compute_new_dt_on_regrid && (i == 0) )
                {
                    int post_regrid_flag = 1;
                    amr_level[0]->computeNewDt(finest_level,
                                               sub_cycle,
                                               n_cycle,
                                               ref_ratio,
                                               dt_min,
                                               dt_level,
                                               stop_time,
                                               post_regrid_flag);
                }

                for (int k(i); k <= finest_level; ++k) {
                    level_count[k] = 0;
                }

                if (old_finest < finest_level)
                {
                    //
                    // The new levels will not have valid time steps
                    // and iteration counts.
                    //
                    for (int k(old_finest + 1); k <= finest_level; ++k)
                    {
                        dt_level[k]    = dt_level[k-1]/n_cycle[k];
                    }
                }
            }
            if (old_finest > finest_level) {
                lev_top = std::min(finest_level, max_level - 1);
            }
        }

        if (max_level == 0 && loadbalance_level0_int > 0 && loadbalance_with_workestimates)
        {
            if (level_steps[0] == 1 || level_count[0] >= loadbalance_level0_int) {
                LoadBalanceLevel0(time);
                level_count[0] = 0;
            }
        }
    }
    //
    // Check to see if should write plotfile.
    // This routine is here so it is done after the restart regrid.
    //
    if (plotfile_on_restart && ! (restart_chkfile.empty()) )
    {
        plotfile_on_restart = 0;
        writePlotFile();
    }
    //
    // Advance grids at this level.
    //
    if (verbose > 0)
    {
        amrex::Print() << "[Level " << level << " step " << level_steps[level]+1 << "] "
                       << "ADVANCE with dt = " << dt_level[level] << "\n";
    }

    Real dt_new = amr_level[level]->advance(time,dt_level[level],iteration,niter);
    BL_PROFILE_REGION_STOP("amr_level.advance");

    dt_min[level] = iteration == 1 ? dt_new : std::min(dt_min[level],dt_new);

    level_steps[level]++;
    level_count[level]++;

    if (verbose > 0)
    {
        amrex::Print() << "[Level " << level << " step " << level_steps[level] << "] "
                       << "Advanced " << amr_level[level]->countCells() << " cells\n";
    }

    // If the level signified that it wants a regrid after the advance has
    // occurred, do that now.
    if (amr_level[level]->postStepRegrid()) {

        int old_finest = finest_level;

        regrid(level, time);

        if (old_finest < finest_level)
        {
            //
            // The new levels will not have valid time steps.
            //
            for (int k = old_finest + 1; k <= finest_level; ++k)
            {
                dt_level[k] = dt_level[k-1] / n_cycle[k];
            }
        }
    }

    //
    // Advance grids at higher level.
    //
    if (level < finest_level)
    {
        const int lev_fine = level+1;

        if (sub_cycle)
        {
            const int ncycle = n_cycle[lev_fine];

            BL_COMM_PROFILE_NAMETAG("Amr::timeStep timeStep subcycle");
            for (int i = 1; i <= ncycle; i++)
                timeStep(lev_fine,time+(i-1)*dt_level[lev_fine],i,ncycle,stop_time);
        }
        else
        {
            BL_COMM_PROFILE_NAMETAG("Amr::timeStep timeStep nosubcycle");
            timeStep(lev_fine,time,1,1,stop_time);
        }
    }

    amr_level[level]->post_timestep(iteration);

    // Set this back to negative so we know whether we are in fact in this routine
    which_level_being_advanced = -1;
}